

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void Cmd_set(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  FStringCVar *this;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 3) {
    pcVar2 = FCommandLine::operator[](argv,1);
    this = (FStringCVar *)FindCVar(pcVar2,(FBaseCVar **)0x0);
    if (this == (FStringCVar *)0x0) {
      this = (FStringCVar *)operator_new(0x38);
      pcVar2 = FCommandLine::operator[](argv,1);
      FStringCVar::FStringCVar
                (this,pcVar2,(char *)0x0,cvar_defflags | 0x120,(_func_void_FStringCVar_ptr *)0x0);
    }
    pcVar2 = FCommandLine::operator[](argv,2);
    FBaseCVar::CmdSet(&this->super_FBaseCVar,pcVar2);
    return;
  }
  Printf("usage: set <variable> <value>\n");
  return;
}

Assistant:

CCMD (set)
{
	if (argv.argc() != 3)
	{
		Printf ("usage: set <variable> <value>\n");
	}
	else
	{
		FBaseCVar *var;

		var = FindCVar (argv[1], NULL);
		if (var == NULL)
			var = new FStringCVar (argv[1], NULL, CVAR_AUTO | CVAR_UNSETTABLE | cvar_defflags);

		var->CmdSet (argv[2]);
	}
}